

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6522Implementation.hpp
# Opt level: O0

void __thiscall
MOS::MOS6522::
MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
::set_control_line_input
          (MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
           *this,Port port,Line line,bool value)

{
  ShiftMode SVar1;
  byte bVar2;
  byte local_31;
  byte local_29;
  bool value_local;
  Line line_local;
  Port port_local;
  MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
  *this_local;
  
  if (line == One) {
    if (value != (bool)((this->super_MOS6522Storage).control_inputs_[port].lines[0] & 1U)) {
      if ((this->super_MOS6522Storage).handshake_modes_[port] == Handshake) {
        set_control_line_output(this,port,Two,On);
      }
      bVar2 = 1;
      if (port != A) {
        bVar2 = 0x10;
      }
      if (value == (((this->super_MOS6522Storage).registers_.peripheral_control & bVar2) != 0)) {
        local_29 = 0x10;
        if (port == A) {
          local_29 = 2;
        }
        (this->super_MOS6522Storage).registers_.interrupt_flags =
             (this->super_MOS6522Storage).registers_.interrupt_flags | local_29;
        reevaluate_interrupts(this);
      }
      if (port == B) {
        SVar1 = MOS6522Storage::shift_mode(&this->super_MOS6522Storage);
        if (SVar1 == InUnderCB1) {
          if (value) {
            shift_in(this);
          }
        }
        else if ((SVar1 == OutUnderCB1) && (!value)) {
          shift_out(this);
        }
      }
    }
    (this->super_MOS6522Storage).control_inputs_[port].lines[0] = value;
  }
  else if (line == Two) {
    if (value != (bool)((this->super_MOS6522Storage).control_inputs_[port].lines[1] & 1U)) {
      bVar2 = 8;
      if (port != A) {
        bVar2 = 0x80;
      }
      if (((this->super_MOS6522Storage).registers_.peripheral_control & bVar2) == 0) {
        bVar2 = 4;
        if (port != A) {
          bVar2 = 0x40;
        }
        if (value == (((this->super_MOS6522Storage).registers_.peripheral_control & bVar2) != 0)) {
          local_31 = 8;
          if (port == A) {
            local_31 = 1;
          }
          (this->super_MOS6522Storage).registers_.interrupt_flags =
               (this->super_MOS6522Storage).registers_.interrupt_flags | local_31;
          reevaluate_interrupts(this);
        }
      }
    }
    (this->super_MOS6522Storage).control_inputs_[port].lines[1] = value;
  }
  return;
}

Assistant:

void MOS6522<T>::set_control_line_input(Port port, Line line, bool value) {
	switch(line) {
		case Line::One:
			if(value != control_inputs_[port].lines[line]) {
				// In handshake mode, any transition on C[A/B]1 sets output high on C[A/B]2.
				if(handshake_modes_[port] == HandshakeMode::Handshake) {
					set_control_line_output(port, Line::Two, LineState::On);
				}

				// Set the proper transition interrupt bit if enabled.
				if(value == !!(registers_.peripheral_control & (port ? 0x10 : 0x01))) {
					registers_.interrupt_flags |= port ? InterruptFlag::CB1ActiveEdge : InterruptFlag::CA1ActiveEdge;
					reevaluate_interrupts();
				}

				// If this is a transition on CB1, consider updating the shift register.
				// TODO: and at least one full clock since the shift register was written?
				if(port == Port::B) {
					switch(shift_mode()) {
						default:													break;
						case ShiftMode::InUnderCB1:		if(value)	shift_in();		break;	// Shifts in are captured on a low-to-high transition.
						case ShiftMode::OutUnderCB1:	if(!value)	shift_out();	break;	// Shifts out are updated on a high-to-low transition.
					}
				}
			}
			control_inputs_[port].lines[line] = value;
		break;

		case Line::Two:
			if(	value != control_inputs_[port].lines[line] &&						// i.e. value has changed ...
				!(registers_.peripheral_control & (port ? 0x80 : 0x08)) &&			// ... and line is input ...
				value == !!(registers_.peripheral_control & (port ? 0x40 : 0x04))	// ... and it's either high or low, as required
			) {
				registers_.interrupt_flags |= port ? InterruptFlag::CB2ActiveEdge : InterruptFlag::CA2ActiveEdge;
				reevaluate_interrupts();
			}
			control_inputs_[port].lines[line] = value;
		break;
	}
}